

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O1

int __thiscall CTcSymPropBase::write_to_obj_file(CTcSymPropBase *this,CVmFile *fp)

{
  uint16_t tmp;
  bool bVar1;
  char b [2];
  char b_1 [4];
  undefined8 uStack_18;
  
  bVar1 = (this->field_0x2a & 1) != 0;
  if (bVar1) {
    uStack_18 = (ulong)*(ushort *)
                        &(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                         super_CVmHashEntry.field_0x24 << 0x10;
    CVmFile::write_bytes(fp,(char *)((long)&uStack_18 + 2),2);
    CTcSymbolBase::write_name_to_file((CTcSymbolBase *)this,fp);
    uStack_18 = (ulong)CONCAT24(this->prop_,(undefined4)uStack_18);
    CVmFile::write_bytes(fp,(char *)((long)&uStack_18 + 4),4);
  }
  return (uint)bVar1;
}

Assistant:

int CTcSymPropBase::write_to_obj_file(CVmFile *fp)
{
    /* 
     *   If the property has never been referenced, don't bother writing it.
     *   We must have picked up the definition from an external symbol set we
     *   loaded but have no references of our own to the property.  
     */
    if (!ref_)
        return FALSE;

    /* inherit default */
    CTcSymbol::write_to_obj_file(fp);

    /* 
     *   write my local property ID value - when we load the object file,
     *   we'll need to figure out the translation from our original numbering
     *   system to the new numbering system used in the final image file 
     */
    fp->write_uint4((ulong)prop_);

    /* written */
    return TRUE;
}